

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_mesh_ngon.cpp
# Opt level: O2

uint __thiscall
ON_MeshFaceList::SetFromTriangleList
          (ON_MeshFaceList *this,size_t triangle_count,size_t triangle_stride,uint *triangles)

{
  uint uVar1;
  uint uVar2;
  uint *puVar3;
  bool bVar4;
  bool bVar5;
  
  bVar5 = triangle_count == 0;
  bVar4 = triangle_stride < 3;
  uVar1 = (uint)triangle_count;
  if ((bVar4 || bVar5) || triangles == (uint *)0x0) {
    uVar1 = 0;
  }
  uVar2 = (uint)triangle_stride;
  if ((bVar4 || bVar5) || triangles == (uint *)0x0) {
    uVar2 = 0;
  }
  puVar3 = (uint *)0x0;
  if (!bVar4 && !bVar5) {
    puVar3 = triangles;
  }
  this->m_bQuadFaces = false;
  this->m_face_count = uVar1;
  this->m_face_stride = uVar2;
  this->m_faces = puVar3;
  return uVar1;
}

Assistant:

unsigned int ON_MeshFaceList::SetFromTriangleList(
  size_t triangle_count,
  size_t triangle_stride,
  const unsigned int* triangles
  )
{
  if ( triangle_count > 0 && triangle_stride >= 3 && 0 != triangles )
  {
    m_bQuadFaces = false;
    m_face_count = (unsigned int)triangle_count;
    m_face_stride = (unsigned int)triangle_stride;
    m_faces = (const unsigned int*)triangles;
  }
  else
  {
    m_bQuadFaces = false;
    m_face_count = 0;
    m_face_stride = 0;
    m_faces = 0;
  }
  return m_face_count;
}